

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioStream.c
# Opt level: O0

UINT8 AudioDrv_WriteData(void *drvStruct,UINT32 dataSize,void *data)

{
  int *piVar1;
  UINT8 UVar2;
  UINT8 retVal;
  ADRV_INSTANCE *fwdInst;
  ADRV_LIST *fwdList;
  AUDIO_DRV *aDrv;
  ADRV_INSTANCE *audInst;
  void *data_local;
  UINT32 dataSize_local;
  void *drvStruct_local;
  
  UVar2 = (**(code **)(*(long *)((long)drvStruct + 8) + 0x80))
                    (*(undefined8 *)((long)drvStruct + 0x20),dataSize,data);
  OSMutex_Lock(*(OS_MUTEX **)((long)drvStruct + 0x40));
  for (fwdInst = *(ADRV_INSTANCE **)((long)drvStruct + 0x38); fwdInst != (ADRV_INSTANCE *)0x0;
      fwdInst = (ADRV_INSTANCE *)fwdInst->drvStruct) {
    piVar1 = *(int **)fwdInst;
    if ((*piVar1 != -1) && (*(long *)(piVar1 + 2) != 0)) {
      (**(code **)(*(long *)(piVar1 + 2) + 0x80))
                (*(undefined8 *)((long)drvStruct + 0x20),dataSize,data);
    }
  }
  OSMutex_Unlock(*(OS_MUTEX **)((long)drvStruct + 0x40));
  return UVar2;
}

Assistant:

UINT8 AudioDrv_WriteData(void* drvStruct, UINT32 dataSize, void* data)
{
	ADRV_INSTANCE* audInst = (ADRV_INSTANCE*)drvStruct;
	AUDIO_DRV* aDrv = audInst->drvStruct;
	ADRV_LIST* fwdList;
	const ADRV_INSTANCE* fwdInst;
	UINT8 retVal;
	
	retVal = aDrv->WriteData(audInst->drvData, dataSize, data);
	
	OSMutex_Lock(audInst->hMutex);
	fwdList = audInst->forwardDrvs;
	while(fwdList != NULL)
	{
		fwdInst = fwdList->drvInst;
		if (fwdInst->ID != ADID_UNUSED && fwdInst->drvStruct != NULL)
			fwdInst->drvStruct->WriteData(audInst->drvData, dataSize, data);
		fwdList = fwdList->next;
	}
	OSMutex_Unlock(audInst->hMutex);
	return retVal;
}